

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsaaudio.c
# Opt level: O0

int input_initialize(snd_pcm_t *handle,short **buffer,int *buffer_l,int channels_num,char *error_msg
                    )

{
  char *pcVar1;
  undefined1 *puVar2;
  uint uVar3;
  short **ppsVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  void *pvVar10;
  ulong uVar11;
  size_t size_00;
  undefined8 uStack_c0;
  undefined1 auStack_b8 [8];
  char *local_b0;
  char *local_a8;
  undefined8 local_a0;
  char *local_98;
  uint local_8c;
  char *local_88;
  uint local_7c;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  int local_5c;
  undefined8 uStack_58;
  int buffer_len_in_bytes;
  snd_pcm_uframes_t size;
  undefined1 *puStack_48;
  uint rate;
  snd_pcm_hw_params_t *hwparams;
  int dir;
  int err;
  char *error_msg_local;
  int *piStack_28;
  int channels_num_local;
  int *buffer_l_local;
  short **buffer_local;
  snd_pcm_t *handle_local;
  
  puStack_48 = (undefined1 *)0x0;
  uStack_c0 = 0x10439b;
  _dir = error_msg;
  error_msg_local._4_4_ = channels_num;
  piStack_28 = buffer_l;
  buffer_l_local = (int *)buffer;
  buffer_local = (short **)handle;
  lVar6 = snd_pcm_hw_params_sizeof();
  lVar6 = -(lVar6 + 0xfU & 0xfffffffffffffff0);
  local_68 = auStack_b8 + lVar6;
  puStack_48 = local_68;
  *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x1043c0;
  sVar7 = snd_pcm_hw_params_sizeof();
  puVar2 = local_68;
  *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x1043ce;
  memset(puVar2,0,sVar7);
  ppsVar4 = buffer_local;
  puVar2 = puStack_48;
  *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x1043db;
  hwparams._4_4_ = snd_pcm_hw_params_any(ppsVar4,puVar2);
  ppsVar4 = buffer_local;
  pcVar1 = _dir;
  puVar2 = puStack_48;
  if (hwparams._4_4_ < 0) {
    *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x1043f5;
    sprintf(pcVar1,"Error initializing hwparams");
    handle_local._4_4_ = -1;
  }
  else {
    *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x104413;
    iVar5 = snd_pcm_hw_params_set_access(ppsVar4,puVar2,3);
    ppsVar4 = buffer_local;
    puVar2 = puStack_48;
    hwparams._4_4_ = iVar5;
    if (iVar5 < 0) {
      local_70 = _dir;
      *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x10442b;
      uVar8 = snd_strerror(iVar5);
      pcVar1 = local_70;
      *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x104440;
      sprintf(pcVar1,"Error setting acecss mode (SND_PCM_ACCESS_RW_INTERLEAVED): %s",uVar8);
      handle_local._4_4_ = -1;
    }
    else {
      *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x10445e;
      iVar5 = snd_pcm_hw_params_set_format(ppsVar4,puVar2,2);
      ppsVar4 = buffer_local;
      uVar3 = error_msg_local._4_4_;
      puVar2 = puStack_48;
      hwparams._4_4_ = iVar5;
      if (iVar5 < 0) {
        local_78 = _dir;
        *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x104476;
        uVar8 = snd_strerror(iVar5);
        pcVar1 = local_78;
        *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x10448b;
        sprintf(pcVar1,"Error setting format (SND_PCM_FORMAT_S16_LE): %s",uVar8);
        handle_local._4_4_ = -1;
      }
      else {
        *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x1044a7;
        iVar5 = snd_pcm_hw_params_set_channels(ppsVar4,puVar2,uVar3);
        ppsVar4 = buffer_local;
        puVar2 = puStack_48;
        hwparams._4_4_ = iVar5;
        if (iVar5 < 0) {
          local_88 = _dir;
          local_7c = error_msg_local._4_4_;
          *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x1044c5;
          uVar8 = snd_strerror(iVar5);
          pcVar1 = local_88;
          uVar11 = (ulong)local_7c;
          *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x1044dd;
          sprintf(pcVar1,"Error setting channels %d: %s",uVar11,uVar8);
          handle_local._4_4_ = -1;
        }
        else {
          size._4_4_ = 48000;
          *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x104505;
          iVar5 = snd_pcm_hw_params_set_rate_near(ppsVar4,puVar2,(long)&size + 4,0);
          ppsVar4 = buffer_local;
          puVar2 = puStack_48;
          hwparams._4_4_ = iVar5;
          if (iVar5 < 0) {
            local_98 = _dir;
            local_8c = size._4_4_;
            *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x104529;
            uVar8 = snd_strerror(iVar5);
            pcVar1 = local_98;
            uVar11 = (ulong)local_8c;
            *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x104547;
            sprintf(pcVar1,"Error setting sample rate (%d): %s",uVar11,uVar8);
            handle_local._4_4_ = -1;
          }
          else {
            uStack_58 = 0x1000;
            hwparams._0_4_ = 0;
            *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x104577;
            iVar5 = snd_pcm_hw_params_set_period_size_near
                              (ppsVar4,puVar2,&stack0xffffffffffffffa8,&hwparams);
            ppsVar4 = buffer_local;
            puVar2 = puStack_48;
            hwparams._4_4_ = iVar5;
            if (iVar5 < 0) {
              local_a8 = _dir;
              local_a0 = uStack_58;
              *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x10459d;
              uVar9 = snd_strerror(iVar5);
              uVar8 = local_a0;
              pcVar1 = local_a8;
              *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x1045bc;
              sprintf(pcVar1,"Error setting buffer size (%lu): %s",uVar8,uVar9);
              handle_local._4_4_ = -1;
            }
            else {
              *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x1045d5;
              iVar5 = snd_pcm_hw_params(ppsVar4,puVar2);
              puVar2 = puStack_48;
              hwparams._4_4_ = iVar5;
              if (iVar5 < 0) {
                local_b0 = _dir;
                *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x1045f0;
                uVar8 = snd_strerror(iVar5);
                pcVar1 = local_b0;
                *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x104608;
                sprintf(pcVar1,"Error writing hwparams: %s",uVar8);
                handle_local._4_4_ = -1;
              }
              else {
                *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x104622;
                snd_pcm_hw_params_get_period_size(puVar2,&stack0xffffffffffffffa8,&hwparams);
                *piStack_28 = (int)uStack_58;
                local_5c = *piStack_28 * 2 * error_msg_local._4_4_;
                size_00 = (size_t)local_5c;
                *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x10464c;
                pvVar10 = hmalloc(size_00);
                *(void **)buffer_l_local = pvVar10;
                pvVar10 = *(void **)buffer_l_local;
                sVar7 = (size_t)local_5c;
                *(undefined8 *)(auStack_b8 + lVar6 + -8) = 0x104668;
                memset(pvVar10,0,sVar7);
                handle_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  return handle_local._4_4_;
}

Assistant:

int input_initialize(snd_pcm_t * handle, short **buffer, int *buffer_l, int channels_num, char *error_msg)
{
	int err;
    int dir;

	snd_pcm_hw_params_t *hwparams = NULL;

	snd_pcm_hw_params_alloca(&hwparams);

	if ((err = snd_pcm_hw_params_any(handle, hwparams)) < 0) {
        sprintf(error_msg, "Error initializing hwparams");
		return -1;
	}

	if ((err = snd_pcm_hw_params_set_access(handle, hwparams, SND_PCM_ACCESS_RW_INTERLEAVED)) < 0) {
        sprintf(error_msg, "Error setting acecss mode (SND_PCM_ACCESS_RW_INTERLEAVED): %s", snd_strerror(err));
		return -1;
	}
	if ((err = snd_pcm_hw_params_set_format(handle, hwparams, SND_PCM_FORMAT_S16_LE)) < 0) {
        sprintf(error_msg, "Error setting format (SND_PCM_FORMAT_S16_LE): %s", snd_strerror(err));
		return -1;
	}
	
    if ((err = snd_pcm_hw_params_set_channels(handle, hwparams, channels_num)) < 0) {
        sprintf(error_msg, "Error setting channels %d: %s", channels_num, snd_strerror(err));
		return -1;
	}

	unsigned int rate = 48000;
	if ((err = snd_pcm_hw_params_set_rate_near(handle, hwparams, &rate, 0)) < 0) {
        sprintf(error_msg, "Error setting sample rate (%d): %s", rate, snd_strerror(err));
		return -1;
	}
	
	snd_pcm_uframes_t size = 4096; /* number of frames */
	
    dir = 0;
	if ((err = snd_pcm_hw_params_set_period_size_near(handle, hwparams, &size, &dir)) < 0) {
        sprintf(error_msg, "Error setting buffer size (%lu): %s", size, snd_strerror(err));
		return -1;
	}

	if ((err = snd_pcm_hw_params(handle, hwparams)) < 0) {
        sprintf(error_msg, "Error writing hwparams: %s", snd_strerror(err));
		return -1;
	}
	
	snd_pcm_hw_params_get_period_size(hwparams, &size, &dir);
	//int extra = (int) size % 5;
	//*buffer_l = (int) size - extra;
	*buffer_l = (int) size;
    int buffer_len_in_bytes = *buffer_l * sizeof(short) * channels_num;
	
//	hlog(LOG_DEBUG, LOGPREFIX "Using sound buffer size: %d frames of %d channels: %d bytes",
//		*buffer_l, channels, buffer_len_in_bytes);
	
	*buffer = (short *) hmalloc(buffer_len_in_bytes);
	bzero(*buffer, buffer_len_in_bytes);
	
	return 0;
}